

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

pair<const_void_*,_int> __thiscall
google::protobuf::SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::
FindExtension(DescriptorIndex<std::pair<const_void_*,_int>_> *this,string *containing_type,
             int field_number)

{
  undefined8 uVar1;
  undefined4 uVar2;
  second_type *psVar3;
  pair<const_void_*,_int> pVar4;
  first_type fStack_58;
  second_type local_30;
  
  std::__cxx11::string::string((string *)&fStack_58,(string *)containing_type);
  local_30.first = (void *)0x0;
  local_30.second = 0;
  fStack_58.second = field_number;
  psVar3 = FindWithDefault<std::map<std::pair<std::__cxx11::string,int>,std::pair<void_const*,int>,std::less<std::pair<std::__cxx11::string,int>>,std::allocator<std::pair<std::pair<std::__cxx11::string,int>const,std::pair<void_const*,int>>>>>
                     (&this->by_extension_,&fStack_58,&local_30);
  uVar1 = psVar3->first;
  uVar2 = psVar3->second;
  pVar4.second = uVar2;
  pVar4.first = (void *)uVar1;
  std::__cxx11::string::~string((string *)&fStack_58);
  pVar4._12_4_ = 0;
  return pVar4;
}

Assistant:

Value SimpleDescriptorDatabase::DescriptorIndex<Value>::FindExtension(
    const string& containing_type,
    int field_number) {
  return FindWithDefault(
      by_extension_, std::make_pair(containing_type, field_number), Value());
}